

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcodecompile.cc
# Opt level: O0

void __thiscall ExprTree::~ExprTree(ExprTree *this)

{
  OpTpl *this_00;
  vector<OpTpl_*,_std::allocator<OpTpl_*>_> *this_01;
  size_type sVar1;
  reference ppOVar2;
  int local_14;
  int4 i;
  ExprTree *this_local;
  
  if ((this->outvn != (VarnodeTpl *)0x0) && (this->outvn != (VarnodeTpl *)0x0)) {
    operator_delete(this->outvn);
  }
  if (this->ops != (vector<OpTpl_*,_std::allocator<OpTpl_*>_> *)0x0) {
    for (local_14 = 0; sVar1 = std::vector<OpTpl_*,_std::allocator<OpTpl_*>_>::size(this->ops),
        (ulong)(long)local_14 < sVar1; local_14 = local_14 + 1) {
      ppOVar2 = std::vector<OpTpl_*,_std::allocator<OpTpl_*>_>::operator[](this->ops,(long)local_14)
      ;
      this_00 = *ppOVar2;
      if (this_00 != (OpTpl *)0x0) {
        OpTpl::~OpTpl(this_00);
        operator_delete(this_00);
      }
    }
    this_01 = this->ops;
    if (this_01 != (vector<OpTpl_*,_std::allocator<OpTpl_*>_> *)0x0) {
      std::vector<OpTpl_*,_std::allocator<OpTpl_*>_>::~vector(this_01);
      operator_delete(this_01);
    }
  }
  return;
}

Assistant:

ExprTree::~ExprTree(void)

{
  if (outvn != (VarnodeTpl *)0)
    delete outvn;
  if (ops != (vector<OpTpl *> *)0) {
    for(int4 i=0;i<ops->size();++i)
      delete (*ops)[i];
    delete ops;
  }
}